

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ptc::Print<char>::operator()
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Print<char> *this,mode *first,
          unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *args)

{
  int iVar1;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (*first == str) {
    if (operator()<std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&>(ptc::mode&&,std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&)
        ::oss_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&operator()<std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&>(ptc::mode&&,std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&)
                                   ::oss_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)
                   &operator()<std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&>(ptc::mode&&,std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&)
                    ::oss_abi_cxx11_);
        __cxa_atexit(std::__cxx11::ostringstream::~ostringstream,
                     &operator()<std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&>(ptc::mode&&,std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&)
                      ::oss_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&operator()<std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&>(ptc::mode&&,std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&)
                             ::oss_abi_cxx11_);
      }
    }
    s_abi_cxx11_(&local_40,"",0);
    std::__cxx11::stringbuf::str((string *)&DAT_001558f8);
    std::__cxx11::string::~string((string *)&local_40);
    std::ios::clear((int)*(undefined8 *)
                          (operator()<std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&>(ptc::mode&&,std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&)
                           ::oss_abi_cxx11_ + -0x18) + 0x1558f0);
    print_backend<std::__cxx11::ostringstream&,std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&>
              (this,(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &operator()<std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&>(ptc::mode&&,std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>&)
                     ::oss_abi_cxx11_,args);
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::basic_string<T_str> operator()( mode&& first, Args&&... args ) const
     { 
      if constexpr( sizeof...( args ) > 0 )
       {
        switch( first )
         {
          case mode::str:
           {
            static std::basic_ostringstream<T_str> oss;
            oss.str( StringConverter<T_str>( ""s ) );
            oss.clear();
            print_backend( oss, std::forward<Args>( args )... );

            return oss.str();
           }
         }
       }
       
      return StringConverter<T_str>( "" );
     }